

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ubjson_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::ubjson::basic_ubjson_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>
::parse(basic_ubjson_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this,
       json_visitor *visitor,error_code *ec)

{
  ulong uVar1;
  bool bVar2;
  char_result<unsigned_char> cVar3;
  reference pvVar4;
  basic_ubjson_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this_00;
  allocator<char> *paVar5;
  basic_ubjson_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *pbVar6;
  size_type sVar7;
  assertion_error *this_01;
  error_code *in_RDX;
  char *in_RSI;
  long in_RDI;
  error_code *in_stack_00000038;
  uint8_t in_stack_00000047;
  json_visitor *in_stack_00000048;
  basic_ubjson_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>
  *in_stack_00000050;
  char_result<unsigned_char> c_1;
  char_result<unsigned_char> c;
  string *in_stack_ffffffffffffff38;
  error_code *in_stack_ffffffffffffff40;
  stream_source<unsigned_char> *in_stack_ffffffffffffff48;
  basic_ubjson_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>
  *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  stream_source<unsigned_char> *in_stack_ffffffffffffff60;
  allocator<char> *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  json_visitor *in_stack_ffffffffffffff88;
  byte local_61;
  uchar local_1c;
  uchar local_1a;
  
  do {
    local_61 = 0;
    if ((*(byte *)(in_RDI + 9) & 1) == 0) {
      local_61 = *(byte *)(in_RDI + 8);
    }
    if ((local_61 & 1) == 0) {
      return;
    }
    pvVar4 = std::
             vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>::
             back((vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
                   *)in_stack_ffffffffffffff40);
    this_00 = (basic_ubjson_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *)
              (ulong)pvVar4->mode;
    switch(this_00) {
    case (basic_ubjson_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *)0x0:
      pvVar4 = std::
               vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
               ::back((vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
                       *)in_stack_ffffffffffffff40);
      pvVar4->mode = accept;
      read_type_and_value(in_stack_ffffffffffffff50,(json_visitor *)in_stack_ffffffffffffff48,
                          in_stack_ffffffffffffff40);
      bVar2 = std::error_code::operator_cast_to_bool(in_RDX);
      if (bVar2) {
        return;
      }
      break;
    case (basic_ubjson_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *)0x1:
      sVar7 = std::
              vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
              ::size((vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
                      *)(in_RDI + 0x1f0));
      if (sVar7 != 1) {
        this_01 = (assertion_error *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
        assertion_error::assertion_error(this_01,in_stack_ffffffffffffff38);
        __cxa_throw(this_01,&assertion_error::typeinfo,assertion_error::~assertion_error);
      }
      std::vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>::
      clear((vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_> *
            )0xde0aaa);
      *(undefined1 *)(in_RDI + 8) = 0;
      *(undefined1 *)(in_RDI + 9) = 1;
      basic_json_visitor<char>::flush((basic_json_visitor<char> *)0xde0ac4);
      break;
    case (basic_ubjson_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *)0x2:
      pvVar4 = std::
               vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
               ::back((vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
                       *)in_stack_ffffffffffffff40);
      in_stack_ffffffffffffff88 = (json_visitor *)pvVar4->index;
      pvVar4 = std::
               vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
               ::back((vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
                       *)in_stack_ffffffffffffff40);
      if (in_stack_ffffffffffffff88 < (json_visitor *)pvVar4->length) {
        pvVar4 = std::
                 vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
                 ::back((vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
                         *)in_stack_ffffffffffffff40);
        pvVar4->index = pvVar4->index + 1;
        read_type_and_value(in_stack_ffffffffffffff50,(json_visitor *)in_stack_ffffffffffffff48,
                            in_stack_ffffffffffffff40);
        bVar2 = std::error_code::operator_cast_to_bool(in_RDX);
        if (bVar2) {
          return;
        }
      }
      else {
        end_array(in_stack_ffffffffffffff50,(json_visitor *)in_stack_ffffffffffffff48,
                  in_stack_ffffffffffffff40);
      }
      break;
    case (basic_ubjson_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *)0x3:
      cVar3 = stream_source<unsigned_char>::peek(in_stack_ffffffffffffff48);
      if (((ushort)cVar3 & 0x100) != 0) {
        std::error_code::operator=
                  ((error_code *)in_stack_ffffffffffffff50,
                   (ubjson_errc)((ulong)in_stack_ffffffffffffff48 >> 0x20));
        *(undefined1 *)(in_RDI + 8) = 0;
        return;
      }
      local_1a = cVar3.value;
      if (local_1a == ']') {
        stream_source<unsigned_char>::ignore
                  (in_stack_ffffffffffffff60,(size_t)in_stack_ffffffffffffff58);
        end_array(in_stack_ffffffffffffff50,(json_visitor *)in_stack_ffffffffffffff48,
                  in_stack_ffffffffffffff40);
        bVar2 = std::error_code::operator_cast_to_bool(in_RDX);
        if (bVar2) {
          return;
        }
      }
      else {
        pvVar4 = std::
                 vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
                 ::back((vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
                         *)in_stack_ffffffffffffff40);
        in_stack_ffffffffffffff70 = (allocator<char> *)(pvVar4->index + 1);
        pvVar4->index = (size_t)in_stack_ffffffffffffff70;
        paVar5 = (allocator<char> *)
                 ubjson_decode_options::max_items((ubjson_decode_options *)(in_RDI + 0x1b0));
        if (paVar5 < in_stack_ffffffffffffff70) {
          std::error_code::operator=
                    ((error_code *)in_stack_ffffffffffffff50,
                     (ubjson_errc)((ulong)in_stack_ffffffffffffff48 >> 0x20));
          *(undefined1 *)(in_RDI + 8) = 0;
          return;
        }
        read_type_and_value(in_stack_ffffffffffffff50,(json_visitor *)in_stack_ffffffffffffff48,
                            in_stack_ffffffffffffff40);
        bVar2 = std::error_code::operator_cast_to_bool(in_RDX);
        if (bVar2) {
          return;
        }
      }
      break;
    case (basic_ubjson_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *)0x4:
      pvVar4 = std::
               vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
               ::back((vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
                       *)in_stack_ffffffffffffff40);
      in_stack_ffffffffffffff80 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pvVar4->index;
      pvVar4 = std::
               vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
               ::back((vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
                       *)in_stack_ffffffffffffff40);
      if (in_stack_ffffffffffffff80 <
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pvVar4->length) {
        pvVar4 = std::
                 vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
                 ::back((vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
                         *)in_stack_ffffffffffffff40);
        pvVar4->index = pvVar4->index + 1;
        in_stack_ffffffffffffff78 = in_RSI;
        std::vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>::
        back((vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
              *)in_stack_ffffffffffffff40);
        read_value(in_stack_00000050,in_stack_00000048,in_stack_00000047,in_stack_00000038);
        bVar2 = std::error_code::operator_cast_to_bool(in_RDX);
        if (bVar2) {
          return;
        }
      }
      else {
        end_array(in_stack_ffffffffffffff50,(json_visitor *)in_stack_ffffffffffffff48,
                  in_stack_ffffffffffffff40);
      }
      break;
    case (basic_ubjson_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *)0x5:
      pvVar4 = std::
               vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
               ::back((vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
                       *)in_stack_ffffffffffffff40);
      uVar1 = pvVar4->index;
      pvVar4 = std::
               vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
               ::back((vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
                       *)in_stack_ffffffffffffff40);
      if (uVar1 < pvVar4->length) {
        pvVar4 = std::
                 vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
                 ::back((vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
                         *)in_stack_ffffffffffffff40);
        pvVar4->index = pvVar4->index + 1;
        read_key(this_00,in_stack_ffffffffffffff88,(error_code *)in_stack_ffffffffffffff80);
        bVar2 = std::error_code::operator_cast_to_bool(in_RDX);
        if (bVar2) {
          return;
        }
        pvVar4 = std::
                 vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
                 ::back((vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
                         *)in_stack_ffffffffffffff40);
        pvVar4->mode = map_value;
      }
      else {
        end_object(in_stack_ffffffffffffff50,(json_visitor *)in_stack_ffffffffffffff48,
                   in_stack_ffffffffffffff40);
      }
      break;
    case (basic_ubjson_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *)0x6:
      pvVar4 = std::
               vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
               ::back((vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
                       *)in_stack_ffffffffffffff40);
      pvVar4->mode = map_key;
      read_type_and_value(in_stack_ffffffffffffff50,(json_visitor *)in_stack_ffffffffffffff48,
                          in_stack_ffffffffffffff40);
      bVar2 = std::error_code::operator_cast_to_bool(in_RDX);
      if (bVar2) {
        return;
      }
      break;
    case (basic_ubjson_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *)0x7:
      pvVar4 = std::
               vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
               ::back((vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
                       *)in_stack_ffffffffffffff40);
      in_stack_ffffffffffffff60 = (stream_source<unsigned_char> *)pvVar4->index;
      pvVar4 = std::
               vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
               ::back((vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
                       *)in_stack_ffffffffffffff40);
      if (in_stack_ffffffffffffff60 < (stream_source<unsigned_char> *)pvVar4->length) {
        pvVar4 = std::
                 vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
                 ::back((vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
                         *)in_stack_ffffffffffffff40);
        pvVar4->index = pvVar4->index + 1;
        read_key(this_00,in_stack_ffffffffffffff88,(error_code *)in_stack_ffffffffffffff80);
        bVar2 = std::error_code::operator_cast_to_bool(in_RDX);
        if (bVar2) {
          return;
        }
        pvVar4 = std::
                 vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
                 ::back((vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
                         *)in_stack_ffffffffffffff40);
        pvVar4->mode = strongly_typed_map_value;
      }
      else {
        end_object(in_stack_ffffffffffffff50,(json_visitor *)in_stack_ffffffffffffff48,
                   in_stack_ffffffffffffff40);
      }
      break;
    case (basic_ubjson_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *)0x8:
      pvVar4 = std::
               vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
               ::back((vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
                       *)in_stack_ffffffffffffff40);
      pvVar4->mode = strongly_typed_map_key;
      in_stack_ffffffffffffff58 = in_RSI;
      std::vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>::
      back((vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_> *)
           in_stack_ffffffffffffff40);
      read_value(in_stack_00000050,in_stack_00000048,in_stack_00000047,in_stack_00000038);
      bVar2 = std::error_code::operator_cast_to_bool(in_RDX);
      if (bVar2) {
        return;
      }
      break;
    case (basic_ubjson_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *)0x9:
      cVar3 = stream_source<unsigned_char>::peek(in_stack_ffffffffffffff48);
      if (((ushort)cVar3 & 0x100) != 0) {
        std::error_code::operator=
                  ((error_code *)in_stack_ffffffffffffff50,
                   (ubjson_errc)((ulong)in_stack_ffffffffffffff48 >> 0x20));
        *(undefined1 *)(in_RDI + 8) = 0;
        return;
      }
      local_1c = cVar3.value;
      if (local_1c == '}') {
        stream_source<unsigned_char>::ignore
                  (in_stack_ffffffffffffff60,(size_t)in_stack_ffffffffffffff58);
        end_object(in_stack_ffffffffffffff50,(json_visitor *)in_stack_ffffffffffffff48,
                   in_stack_ffffffffffffff40);
        bVar2 = std::error_code::operator_cast_to_bool(in_RDX);
        if (bVar2) {
          return;
        }
      }
      else {
        pvVar4 = std::
                 vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
                 ::back((vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
                         *)in_stack_ffffffffffffff40);
        in_stack_ffffffffffffff50 =
             (basic_ubjson_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *)
             (pvVar4->index + 1);
        pvVar4->index = (size_t)in_stack_ffffffffffffff50;
        pbVar6 = (basic_ubjson_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>
                  *)ubjson_decode_options::max_items((ubjson_decode_options *)(in_RDI + 0x1b0));
        if (pbVar6 < in_stack_ffffffffffffff50) {
          std::error_code::operator=
                    ((error_code *)in_stack_ffffffffffffff50,
                     (ubjson_errc)((ulong)in_stack_ffffffffffffff48 >> 0x20));
          *(undefined1 *)(in_RDI + 8) = 0;
          return;
        }
        read_key(this_00,in_stack_ffffffffffffff88,(error_code *)in_stack_ffffffffffffff80);
        bVar2 = std::error_code::operator_cast_to_bool(in_RDX);
        if (bVar2) {
          return;
        }
        pvVar4 = std::
                 vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
                 ::back((vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
                         *)in_stack_ffffffffffffff40);
        pvVar4->mode = indefinite_map_value;
      }
      break;
    case (basic_ubjson_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *)0xa:
      pvVar4 = std::
               vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
               ::back((vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
                       *)in_stack_ffffffffffffff40);
      pvVar4->mode = indefinite_map_key;
      read_type_and_value(in_stack_ffffffffffffff50,(json_visitor *)in_stack_ffffffffffffff48,
                          in_stack_ffffffffffffff40);
      bVar2 = std::error_code::operator_cast_to_bool(in_RDX);
      if (bVar2) {
        return;
      }
    }
  } while( true );
}

Assistant:

void parse(json_visitor& visitor, std::error_code& ec)
    {
        while (!done_ && more_)
        {
            switch (state_stack_.back().mode)
            {
                case parse_mode::array:
                {
                    if (state_stack_.back().index < state_stack_.back().length)
                    {
                        ++state_stack_.back().index;
                        read_type_and_value(visitor, ec);
                        if (JSONCONS_UNLIKELY(ec))
                        {
                            return;
                        }
                    }
                    else
                    {
                        end_array(visitor, ec);
                    }
                    break;
                }
                case parse_mode::strongly_typed_array:
                {
                    if (state_stack_.back().index < state_stack_.back().length)
                    {
                        ++state_stack_.back().index;
                        read_value(visitor, state_stack_.back().type, ec);
                        if (JSONCONS_UNLIKELY(ec))
                        {
                            return;
                        }
                    }
                    else
                    {
                        end_array(visitor, ec);
                    }
                    break;
                }
                case parse_mode::indefinite_array:
                {
                    auto c = source_.peek();
                    if (JSONCONS_UNLIKELY(c.eof))
                    {
                        ec = ubjson_errc::unexpected_eof;
                        more_ = false;
                        return;
                    }
                    if (c.value == jsoncons::ubjson::ubjson_type::end_array_marker)
                    {
                        source_.ignore(1);
                        end_array(visitor, ec);
                        if (JSONCONS_UNLIKELY(ec))
                        {
                            return;
                        }
                    }
                    else
                    {
                        if (++state_stack_.back().index > options_.max_items())
                        {
                            ec = ubjson_errc::max_items_exceeded;
                            more_ = false;
                            return;
                        }
                        read_type_and_value(visitor, ec);
                        if (JSONCONS_UNLIKELY(ec))
                        {
                            return;
                        }
                    }
                    break;
                }
                case parse_mode::map_key:
                {
                    if (state_stack_.back().index < state_stack_.back().length)
                    {
                        ++state_stack_.back().index;
                        read_key(visitor, ec);
                        if (JSONCONS_UNLIKELY(ec))
                        {
                            return;
                        }
                        state_stack_.back().mode = parse_mode::map_value;
                    }
                    else
                    {
                        end_object(visitor, ec);
                    }
                    break;
                }
                case parse_mode::map_value:
                {
                    state_stack_.back().mode = parse_mode::map_key;
                    read_type_and_value(visitor, ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        return;
                    }
                    break;
                }
                case parse_mode::strongly_typed_map_key:
                {
                    if (state_stack_.back().index < state_stack_.back().length)
                    {
                        ++state_stack_.back().index;
                        read_key(visitor, ec);
                        if (JSONCONS_UNLIKELY(ec))
                        {
                            return;
                        }
                        state_stack_.back().mode = parse_mode::strongly_typed_map_value;
                    }
                    else
                    {
                        end_object(visitor, ec);
                    }
                    break;
                }
                case parse_mode::strongly_typed_map_value:
                {
                    state_stack_.back().mode = parse_mode::strongly_typed_map_key;
                    read_value(visitor, state_stack_.back().type, ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        return;
                    }
                    break;
                }
                case parse_mode::indefinite_map_key:
                {
                    auto c = source_.peek();
                    if (JSONCONS_UNLIKELY(c.eof))
                    {
                        ec = ubjson_errc::unexpected_eof;
                        more_ = false;
                        return;
                    }
                    if (c.value == jsoncons::ubjson::ubjson_type::end_object_marker)
                    {
                        source_.ignore(1);
                        end_object(visitor, ec);
                        if (JSONCONS_UNLIKELY(ec))
                        {
                            return;
                        }
                    }
                    else
                    {
                        if (++state_stack_.back().index > options_.max_items())
                        {
                            ec = ubjson_errc::max_items_exceeded;
                            more_ = false;
                            return;
                        }
                        read_key(visitor, ec);
                        if (JSONCONS_UNLIKELY(ec))
                        {
                            return;
                        }
                        state_stack_.back().mode = parse_mode::indefinite_map_value;
                    }
                    break;
                }
                case parse_mode::indefinite_map_value:
                {
                    state_stack_.back().mode = parse_mode::indefinite_map_key;
                    read_type_and_value(visitor, ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        return;
                    }
                    break;
                }
                case parse_mode::root:
                {
                    state_stack_.back().mode = parse_mode::accept;
                    read_type_and_value(visitor, ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        return;
                    }
                    break;
                }
                case parse_mode::accept:
                {
                    JSONCONS_ASSERT(state_stack_.size() == 1);
                    state_stack_.clear();
                    more_ = false;
                    done_ = true;
                    visitor.flush();
                    break;
                }
            }
        }
    }